

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-filenames.cc
# Opt level: O2

void __thiscall filenames_GetBasename_Test::TestBody(filenames_GetBasename_Test *this)

{
  char *in_RCX;
  char *in_RDX;
  string_view sVar1;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view filename_04;
  string_view filename_05;
  string_view filename_06;
  string_view sv;
  string_view sv_00;
  string_view sv_01;
  string_view sv_02;
  string_view sv_03;
  string_view sv_04;
  string_view sv_05;
  string_view sv_06;
  string_view sv_07;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  
  sVar1._M_str = in_RDX;
  sVar1._M_len = (size_t)"/bar/dir/foo.txt";
  sVar1 = wabt::GetBasename((wabt *)0x10,sVar1);
  sv._M_len = sVar1._M_str;
  sv._M_str = in_RCX;
  anon_unknown.dwarf_b869a::assert_string_view_eq
            ((anon_unknown_dwarf_b869a *)0x1d2aa0,(char *)sVar1._M_len,sv);
  filename._M_str = extraout_RDX;
  filename._M_len = (size_t)"bar/dir/foo.txt";
  sVar1 = wabt::GetBasename((wabt *)0xf,filename);
  sv_00._M_len = sVar1._M_str;
  sv_00._M_str = in_RCX;
  anon_unknown.dwarf_b869a::assert_string_view_eq
            ((anon_unknown_dwarf_b869a *)0x1d2aa0,(char *)sVar1._M_len,sv_00);
  filename_00._M_str = extraout_RDX_00;
  filename_00._M_len = (size_t)"/foo.txt";
  sVar1 = wabt::GetBasename((wabt *)0x8,filename_00);
  sv_01._M_len = sVar1._M_str;
  sv_01._M_str = in_RCX;
  anon_unknown.dwarf_b869a::assert_string_view_eq
            ((anon_unknown_dwarf_b869a *)0x1d2aa0,(char *)sVar1._M_len,sv_01);
  filename_01._M_str = extraout_RDX_01;
  filename_01._M_len = (size_t)"\\bar\\dir\\foo.txt";
  sVar1 = wabt::GetBasename((wabt *)0x10,filename_01);
  sv_02._M_len = sVar1._M_str;
  sv_02._M_str = in_RCX;
  anon_unknown.dwarf_b869a::assert_string_view_eq
            ((anon_unknown_dwarf_b869a *)0x1d2aa0,(char *)sVar1._M_len,sv_02);
  filename_02._M_str = extraout_RDX_02;
  filename_02._M_len = (size_t)"bar\\dir\\foo.txt";
  sVar1 = wabt::GetBasename((wabt *)0xf,filename_02);
  sv_03._M_len = sVar1._M_str;
  sv_03._M_str = in_RCX;
  anon_unknown.dwarf_b869a::assert_string_view_eq
            ((anon_unknown_dwarf_b869a *)0x1d2aa0,(char *)sVar1._M_len,sv_03);
  filename_03._M_str = extraout_RDX_03;
  filename_03._M_len = (size_t)"\\foo.txt";
  sVar1 = wabt::GetBasename((wabt *)0x8,filename_03);
  sv_04._M_len = sVar1._M_str;
  sv_04._M_str = in_RCX;
  anon_unknown.dwarf_b869a::assert_string_view_eq
            ((anon_unknown_dwarf_b869a *)0x1d2aa0,(char *)sVar1._M_len,sv_04);
  filename_04._M_str = extraout_RDX_04;
  filename_04._M_len = (size_t)"foo.txt";
  sVar1 = wabt::GetBasename((wabt *)0x7,filename_04);
  sv_05._M_len = sVar1._M_str;
  sv_05._M_str = in_RCX;
  anon_unknown.dwarf_b869a::assert_string_view_eq
            ((anon_unknown_dwarf_b869a *)0x1d2aa0,(char *)sVar1._M_len,sv_05);
  filename_05._M_str = extraout_RDX_05;
  filename_05._M_len = (size_t)"foo";
  sVar1 = wabt::GetBasename((wabt *)0x3,filename_05);
  sv_06._M_len = sVar1._M_str;
  sv_06._M_str = in_RCX;
  anon_unknown.dwarf_b869a::assert_string_view_eq
            ((anon_unknown_dwarf_b869a *)0x1df490,(char *)sVar1._M_len,sv_06);
  filename_06._M_str = extraout_RDX_06;
  filename_06._M_len = (size_t)"";
  sVar1 = wabt::GetBasename((wabt *)0x0,filename_06);
  sv_07._M_len = sVar1._M_str;
  sv_07._M_str = in_RCX;
  anon_unknown.dwarf_b869a::assert_string_view_eq
            ((anon_unknown_dwarf_b869a *)0x1d4f3a,(char *)sVar1._M_len,sv_07);
  return;
}

Assistant:

TEST(filenames, GetBasename) {
  assert_string_view_eq("foo.txt", GetBasename("/bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar/dir/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("/foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("bar\\dir\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("\\foo.txt"));
  assert_string_view_eq("foo.txt", GetBasename("foo.txt"));
  assert_string_view_eq("foo", GetBasename("foo"));
  assert_string_view_eq("", GetBasename(""));
}